

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAssemblerLabel.cpp
# Opt level: O2

void __thiscall CAssemblerLabel::writeTempData(CAssemblerLabel *this,TempData *tempData)

{
  element_type *args;
  int64_t memoryAddress;
  bool bVar1;
  string sStack_38;
  
  bVar1 = SymbolTable::isGeneratedLabel
                    (&Global.symbolTable,
                     &((this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      name);
  if (!bVar1) {
    args = (this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    memoryAddress = args->value;
    tinyformat::format<Identifier>(&sStack_38,"%s:",&args->name);
    TempData::writeLine(tempData,memoryAddress,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return;
}

Assistant:

void CAssemblerLabel::writeTempData(TempData& tempData) const
{
	if (!Global.symbolTable.isGeneratedLabel(label->getName()))
		tempData.writeLine(label->getValue(),tfm::format("%s:",label->getName()));
}